

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugFrame.cpp
# Opt level: O2

void __thiscall
llvm::DWARFDebugFrame::dump
          (DWARFDebugFrame *this,raw_ostream *OS,MCRegisterInfo *MRI,Optional<unsigned_long> Offset)

{
  pointer puVar1;
  unsigned_long *puVar2;
  FrameEntry *pFVar3;
  unique_ptr<llvm::dwarf::FrameEntry,_std::default_delete<llvm::dwarf::FrameEntry>_> *Entry;
  pointer puVar4;
  anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2 local_40;
  Optional<unsigned_long> Offset_local;
  
  local_40 = Offset.Storage.field_0;
  Offset_local.Storage.field_0.empty = Offset.Storage.hasVal;
  if (((undefined1  [16])Offset.Storage & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    raw_ostream::operator<<(OS,"\n");
    puVar1 = (this->Entries).
             super__Vector_base<std::unique_ptr<llvm::dwarf::FrameEntry,_std::default_delete<llvm::dwarf::FrameEntry>_>,_std::allocator<std::unique_ptr<llvm::dwarf::FrameEntry,_std::default_delete<llvm::dwarf::FrameEntry>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar4 = (this->Entries).
                  super__Vector_base<std::unique_ptr<llvm::dwarf::FrameEntry,_std::default_delete<llvm::dwarf::FrameEntry>_>,_std::allocator<std::unique_ptr<llvm::dwarf::FrameEntry,_std::default_delete<llvm::dwarf::FrameEntry>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; puVar4 != puVar1; puVar4 = puVar4 + 1)
    {
      pFVar3 = (puVar4->_M_t).
               super___uniq_ptr_impl<llvm::dwarf::FrameEntry,_std::default_delete<llvm::dwarf::FrameEntry>_>
               ._M_t.
               super__Tuple_impl<0UL,_llvm::dwarf::FrameEntry_*,_std::default_delete<llvm::dwarf::FrameEntry>_>
               .super__Head_base<0UL,_llvm::dwarf::FrameEntry_*,_false>._M_head_impl;
      (*pFVar3->_vptr_FrameEntry[2])(pFVar3,OS,MRI,(ulong)this->IsEH);
    }
  }
  else {
    puVar2 = optional_detail::OptionalStorage<unsigned_long,_true>::getValue
                       ((OptionalStorage<unsigned_long,_true> *)&local_40);
    pFVar3 = getEntryAtOffset(this,*puVar2);
    if (pFVar3 != (FrameEntry *)0x0) {
      (*pFVar3->_vptr_FrameEntry[2])(pFVar3,OS,MRI,(ulong)this->IsEH);
    }
  }
  return;
}

Assistant:

void DWARFDebugFrame::dump(raw_ostream &OS, const MCRegisterInfo *MRI,
                           Optional<uint64_t> Offset) const {
  if (Offset) {
    if (auto *Entry = getEntryAtOffset(*Offset))
      Entry->dump(OS, MRI, IsEH);
    return;
  }

  OS << "\n";
  for (const auto &Entry : Entries)
    Entry->dump(OS, MRI, IsEH);
}